

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-object.c
# Opt level: O2

void display_object_kind_recall(object_kind *kind)

{
  object object;
  object known_obj;
  
  memset(&object,0,0x138);
  memset(&known_obj,0,0x138);
  object_prep(&object,kind,L'\0',EXTREMIFY);
  if ((kind->aware != false) || (kind->flavor == (flavor *)0x0)) {
    object_copy(&known_obj,&object);
  }
  object.known = &known_obj;
  display_object_recall(&object);
  object_wipe(&known_obj);
  object_wipe(&object);
  return;
}

Assistant:

void display_object_kind_recall(struct object_kind *kind)
{
	struct object object = OBJECT_NULL, known_obj = OBJECT_NULL;
	object_prep(&object, kind, 0, EXTREMIFY);
	if (kind->aware || !kind->flavor) {
		object_copy(&known_obj, &object);
	}
	object.known = &known_obj;

	display_object_recall(&object);
	object_wipe(&known_obj);
	object_wipe(&object);
}